

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptNativeFloatArray::SetItem(JavascriptNativeFloatArray *this,uint32 index,double dValue)

{
  Var newValue;
  
  if (MissingItem == dValue) {
    ToVarArray(this);
    newValue = JavascriptNumber::ToVarNoCheck
                         (dValue,(((((this->super_JavascriptNativeArray).super_JavascriptArray.
                                     super_ArrayObject.super_DynamicObject.super_RecyclableObject.
                                     type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase
                                 ).scriptContext.ptr);
    JavascriptArray::DirectSetItemAt<void*>((JavascriptArray *)this,index,newValue);
  }
  else {
    JavascriptArray::DirectSetItemAt<double>((JavascriptArray *)this,index,dValue);
  }
  return 1;
}

Assistant:

BOOL JavascriptNativeFloatArray::SetItem(uint32 index, double dValue)
    {
        if (*(uint64*)&dValue == *(uint64*)&JavascriptNativeFloatArray::MissingItem)
        {
            JavascriptArray *varArr = JavascriptNativeFloatArray::ToVarArray(this);
            varArr->DirectSetItemAt(index, JavascriptNumber::ToVarNoCheck(dValue, GetScriptContext()));
            return TRUE;
        }

        this->DirectSetItemAt<double>(index, dValue);
        return TRUE;
    }